

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O2

int __thiscall HttpServer::GET(HttpServer *this,char *url_pattern,handler_t *callback)

{
  undefined8 uVar1;
  allocator local_51;
  function<void_(HttpRequest_&)> local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,url_pattern,&local_51);
  std::function<void_(HttpRequest_&)>::function(&local_50,callback);
  httprouter::node::addRoute(&this->no,&local_30,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  uVar1 = std::__cxx11::string::~string((string *)&local_30);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  std::__cxx11::string::~string((string *)&local_30);
  _Unwind_Resume(uVar1);
}

Assistant:

int GET(char *url_pattern, handler_t callback)
    {
        no.addRoute(url_pattern, callback);
    }